

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void incstep(lua_State *L,global_State *g)

{
  uint uVar1;
  lu_mem lVar2;
  bool bVar3;
  long local_40;
  lu_mem work;
  l_mem stepsize;
  l_mem debt;
  int stepmul;
  global_State *g_local;
  lua_State *L_local;
  
  uVar1 = (uint)g->gcstepmul << 2 | 1;
  stepsize = ((ulong)g->GCdebt >> 4) * (long)(int)uVar1;
  if (g->gcstepsize < 0x3f) {
    local_40 = ((ulong)(1L << (g->gcstepsize & 0x3f)) >> 4) * (long)(int)uVar1;
  }
  else {
    local_40 = 0x7fffffffffffffff;
  }
  do {
    lVar2 = singlestep(L);
    stepsize = stepsize - lVar2;
    bVar3 = false;
    if (-local_40 < stepsize) {
      bVar3 = g->gcstate != '\b';
    }
  } while (bVar3);
  if (g->gcstate == '\b') {
    setpause(g);
  }
  else {
    luaE_setdebt(g,stepsize / (long)(int)uVar1 << 4);
  }
  return;
}

Assistant:

static void incstep (lua_State *L, global_State *g) {
  int stepmul = (getgcparam(g->gcstepmul) | 1);  /* avoid division by 0 */
  l_mem debt = (g->GCdebt / WORK2MEM) * stepmul;
  l_mem stepsize = (g->gcstepsize <= log2maxs(l_mem))
                 ? ((cast(l_mem, 1) << g->gcstepsize) / WORK2MEM) * stepmul
                 : MAX_LMEM;  /* overflow; keep maximum value */
  do {  /* repeat until pause or enough "credit" (negative debt) */
    lu_mem work = singlestep(L);  /* perform one single step */
    debt -= work;
  } while (debt > -stepsize && g->gcstate != GCSpause);
  if (g->gcstate == GCSpause)
    setpause(g);  /* pause until next cycle */
  else {
    debt = (debt / stepmul) * WORK2MEM;  /* convert 'work units' to bytes */
    luaE_setdebt(g, debt);
  }
}